

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O2

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,UInt u)

{
  DasmStyle *pDVar1;
  int digits;
  ulong value;
  
  value = (ulong)u.raw;
  pDVar1 = this->style;
  if ((pDVar1->numberFormat).radix == '\n') {
    sprintd(&this->ptr,value);
  }
  else {
    digits = hexDigits(value);
    sprintx(&this->ptr,value,&pDVar1->numberFormat,digits);
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(UInt u)
{
    sprint(ptr, u.raw, style.numberFormat);
    return *this;
}